

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrShareSpatialAnchorAsyncBD
                   (XrSenseDataProviderBD provider,XrSpatialAnchorShareInfoBD *info,
                   XrFutureEXT *future)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_479;
  string local_478 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_458;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_310;
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  GenValidUsageXrInstanceInfo *local_2a8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrSenseDataProviderBD_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrFutureEXT *future_local;
  XrSpatialAnchorShareInfoBD *info_local;
  XrSenseDataProviderBD provider_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  info_local = (XrSpatialAnchorShareInfoBD *)provider;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSenseDataProviderBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrSenseDataProviderBD_T **)&info_local,&local_4c);
  VVar1 = VerifyXrSenseDataProviderBDHandle((XrSenseDataProviderBD *)&info_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSenseDataProviderBD_T_*>::getWithInstanceInfo
                      (&g_sensedataproviderbd_info,(XrSenseDataProviderBD_T *)info_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a8 = pGVar2;
    gen_sensedataproviderbd_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (info == (XrSpatialAnchorShareInfoBD *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c8,"VUID-xrShareSpatialAnchorAsyncBD-info-parameter",&local_2c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"xrShareSpatialAnchorAsyncBD",&local_2f1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_310,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_330,
                 "Invalid NULL for XrSpatialAnchorShareInfoBD \"info\" which is not optional and must be non-NULL"
                 ,&local_331);
      CoreValidLogMessage(pGVar2,(string *)local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f0,&local_310,(string *)local_330);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_310);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      provider_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"xrShareSpatialAnchorAsyncBD",&local_359);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_358,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,true,true,info);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      pGVar2 = local_2a8;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if (future == (XrFutureEXT *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_410,"VUID-xrShareSpatialAnchorAsyncBD-future-parameter",&local_411);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_438,"xrShareSpatialAnchorAsyncBD",&local_439);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_458,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_478,
                     "Invalid NULL for XrFutureEXT \"future\" which is not optional and must be non-NULL"
                     ,&local_479);
          CoreValidLogMessage(pGVar2,(string *)local_410,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_438,&local_458,(string *)local_478);
          std::__cxx11::string::~string(local_478);
          std::allocator<char>::~allocator((allocator<char> *)&local_479);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_458);
          std::__cxx11::string::~string(local_438);
          std::allocator<char>::~allocator((allocator<char> *)&local_439);
          std::__cxx11::string::~string(local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
          provider_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          provider_local._4_4_ =
               objects_info.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          info_with_instance.second._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_380,"VUID-xrShareSpatialAnchorAsyncBD-info-parameter",&local_381);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a8,"xrShareSpatialAnchorAsyncBD",&local_3a9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3c8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3e8,"Command xrShareSpatialAnchorAsyncBD param info is invalid",&local_3e9)
        ;
        CoreValidLogMessage(pGVar2,(string *)local_380,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3a8,&local_3c8,(string *)local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3c8);
        std::__cxx11::string::~string(local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        std::__cxx11::string::~string(local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
        provider_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrSenseDataProviderBD handle \"provider\" ");
    HandleToHexString<XrSenseDataProviderBD_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_218,"VUID-xrShareSpatialAnchorAsyncBD-provider-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrShareSpatialAnchorAsyncBD",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    provider_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return provider_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrShareSpatialAnchorAsyncBD(
XrSenseDataProviderBD provider,
const XrSpatialAnchorShareInfoBD* info,
XrFutureEXT* future) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(provider, XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSenseDataProviderBDHandle(&provider);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSenseDataProviderBD handle \"provider\" ";
                oss << HandleToHexString(provider);
                CoreValidLogMessage(nullptr, "VUID-xrShareSpatialAnchorAsyncBD-provider-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorAsyncBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sensedataproviderbd_info.getWithInstanceInfo(provider);
        GenValidUsageXrHandleInfo *gen_sensedataproviderbd_info = info_with_instance.first;
        (void)gen_sensedataproviderbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == info) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrShareSpatialAnchorAsyncBD-info-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorAsyncBD", objects_info,
                                "Invalid NULL for XrSpatialAnchorShareInfoBD \"info\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSpatialAnchorShareInfoBD is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrShareSpatialAnchorAsyncBD", objects_info,
                                                        true, true, info);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrShareSpatialAnchorAsyncBD-info-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorAsyncBD",
                                objects_info,
                                "Command xrShareSpatialAnchorAsyncBD param info is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == future) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrShareSpatialAnchorAsyncBD-future-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrShareSpatialAnchorAsyncBD", objects_info,
                                "Invalid NULL for XrFutureEXT \"future\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrShareSpatialAnchorAsyncBD-future-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}